

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  Song *pSVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  size_t sVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  istream *piVar9;
  ulong uVar10;
  ulong *puVar11;
  long lVar12;
  ostream *poVar13;
  out_of_range *this;
  ulong *puVar14;
  Song *extraout_RDX;
  Song *extraout_RDX_00;
  Song *extraout_RDX_01;
  Song *pSVar15;
  Song *extraout_RDX_02;
  Song *extraout_RDX_03;
  ulong uVar16;
  ulong uVar17;
  size_t sVar18;
  string *psVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  ulong uVar21;
  long lVar22;
  Song tmp;
  string artist;
  string title;
  int count;
  int n;
  Song s;
  undefined1 local_158 [32];
  _Alloc_hider local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  int local_118;
  undefined1 *local_110;
  long local_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  ulong local_d0;
  int local_c4;
  int local_c0;
  int local_bc;
  string local_b8;
  string local_98;
  Song local_78;
  
  std::istream::operator>>((istream *)&std::cin,&local_bc);
  if (0 < local_bc) {
    iVar8 = 0;
    do {
      local_c4 = iVar8;
      local_f0 = &local_e0;
      local_110 = &local_100;
      local_e8 = 0;
      local_e0 = 0;
      local_108 = 0;
      local_100 = 0;
      piVar9 = std::operator>>((istream *)&std::cin,(string *)&local_f0);
      piVar9 = std::operator>>(piVar9,(string *)&local_110);
      std::istream::operator>>(piVar9,&local_c0);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_f0,local_f0 + local_e8);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_110,local_110 + local_108)
      ;
      Song::Song(&local_78,&local_98,&local_b8,local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      sVar5 = pq1.mSize;
      sVar18 = pq1.mCap;
      if (pq1.mCap < pq1.mSize + 1) {
        uVar21 = pq1.mCap * 2;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar21;
        uVar10 = SUB168(auVar3 * ZEXT816(0x48),0) | 8;
        if (SUB168(auVar3 * ZEXT816(0x48),8) != 0) {
          uVar10 = 0xffffffffffffffff;
        }
        puVar11 = (ulong *)operator_new__(uVar10);
        *puVar11 = uVar21;
        if (uVar21 != 0) {
          lVar12 = sVar18 * 0x90;
          puVar14 = puVar11 + 7;
          do {
            puVar14[-6] = (ulong)(puVar14 + -4);
            puVar14[-5] = 0;
            *(undefined1 *)(puVar14 + -4) = 0;
            puVar14[-2] = (ulong)puVar14;
            puVar14[-1] = 0;
            *(undefined1 *)puVar14 = 0;
            puVar14 = puVar14 + 9;
            lVar12 = lVar12 + -0x48;
          } while (lVar12 != 0);
        }
        local_d0 = uVar21;
        if (sVar5 != 0) {
          psVar19 = (string *)(puVar11 + 5);
          lVar12 = 0;
          uVar21 = 0;
          do {
            pSVar15 = pq1.mData;
            std::__cxx11::string::_M_assign(psVar19 + -0x20);
            std::__cxx11::string::_M_assign(psVar19);
            *(undefined4 *)(psVar19 + 0x20) = *(undefined4 *)((long)&pSVar15->count + lVar12);
            uVar21 = uVar21 + 1;
            psVar19 = psVar19 + 0x48;
            lVar12 = lVar12 + 0x48;
          } while (uVar21 < pq1.mSize);
        }
        uVar21 = local_d0;
        pSVar15 = pq1.mData;
        if (pq1.mData != (Song *)0x0) {
          lVar12 = *(long *)&pq1.mData[-1].count;
          if (lVar12 != 0) {
            paVar20 = &pq1.mData[lVar12 + -1].title.field_2;
            lVar22 = lVar12 * -0x48;
            do {
              if (paVar20 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar20->_M_allocated_capacity)[-2]) {
                operator_delete((long *)(&paVar20->_M_allocated_capacity)[-2],
                                paVar20->_M_allocated_capacity + 1);
              }
              if (&paVar20->_M_allocated_capacity + -4 !=
                  (size_type *)(&paVar20->_M_allocated_capacity)[-6]) {
                operator_delete((size_type *)(&paVar20->_M_allocated_capacity)[-6],
                                (&paVar20->_M_allocated_capacity)[-4] + 1);
              }
              paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(&paVar20->_M_allocated_capacity + -9);
              lVar22 = lVar22 + 0x48;
            } while (lVar22 != 0);
          }
          operator_delete__(&pSVar15[-1].count,lVar12 * 0x48 + 8);
        }
        pq1.mData = (Song *)(puVar11 + 1);
        pq1.mCap = uVar21;
      }
      pSVar15 = pq1.mData + pq1.mSize;
      std::__cxx11::string::_M_assign((string *)pSVar15);
      std::__cxx11::string::_M_assign((string *)&pSVar15->title);
      pSVar15->count = local_78.count;
      sVar18 = pq1.mSize;
      pSVar15 = pq1.mData + pq1.mSize;
      pq1.mSize = pq1.mSize + 1;
      Song::Song((Song *)local_158,pSVar15);
      pSVar15 = extraout_RDX;
      while (sVar18 != 0) {
        uVar21 = sVar18 - 1 >> 1;
        bVar7 = CP::
                priority_queue<Song,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/noppakorn[P]2110211/grader/d58_q2_custom/song.h:30:11)>
                ::anon_class_1_0_00000001_for_mLess::operator()
                          ((anon_class_1_0_00000001_for_mLess *)local_158,pq1.mData + uVar21,pSVar15
                          );
        pSVar15 = pq1.mData;
        if (bVar7) goto LAB_001028ad;
        pSVar1 = pq1.mData + sVar18;
        std::__cxx11::string::_M_assign((string *)pSVar1);
        std::__cxx11::string::_M_assign((string *)&pSVar1->title);
        pSVar1->count = pSVar15[uVar21].count;
        pSVar15 = extraout_RDX_00;
        sVar18 = uVar21;
      }
      sVar18 = 0;
LAB_001028ad:
      pSVar15 = pq1.mData + sVar18;
      std::__cxx11::string::_M_assign((string *)pSVar15);
      std::__cxx11::string::_M_assign((string *)&pSVar15->title);
      pSVar15->count = local_118;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_p != &local_128) {
        operator_delete(local_138._M_p,local_128._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
      sVar5 = pq2.mSize;
      sVar18 = pq2.mCap;
      if (pq2.mCap < pq2.mSize + 1) {
        uVar21 = pq2.mCap * 2;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar21;
        uVar10 = SUB168(auVar4 * ZEXT816(0x48),0) | 8;
        if (SUB168(auVar4 * ZEXT816(0x48),8) != 0) {
          uVar10 = 0xffffffffffffffff;
        }
        puVar11 = (ulong *)operator_new__(uVar10);
        *puVar11 = uVar21;
        if (uVar21 != 0) {
          lVar12 = sVar18 * 0x90;
          puVar14 = puVar11 + 7;
          do {
            puVar14[-6] = (ulong)(puVar14 + -4);
            puVar14[-5] = 0;
            *(undefined1 *)(puVar14 + -4) = 0;
            puVar14[-2] = (ulong)puVar14;
            puVar14[-1] = 0;
            *(undefined1 *)puVar14 = 0;
            puVar14 = puVar14 + 9;
            lVar12 = lVar12 + -0x48;
          } while (lVar12 != 0);
        }
        local_d0 = uVar21;
        if (sVar5 != 0) {
          psVar19 = (string *)(puVar11 + 5);
          lVar12 = 0;
          uVar21 = 0;
          do {
            pSVar15 = pq2.mData;
            std::__cxx11::string::_M_assign(psVar19 + -0x20);
            std::__cxx11::string::_M_assign(psVar19);
            *(undefined4 *)(psVar19 + 0x20) = *(undefined4 *)((long)&pSVar15->count + lVar12);
            uVar21 = uVar21 + 1;
            psVar19 = psVar19 + 0x48;
            lVar12 = lVar12 + 0x48;
          } while (uVar21 < pq2.mSize);
        }
        uVar21 = local_d0;
        pSVar15 = pq2.mData;
        if (pq2.mData != (Song *)0x0) {
          lVar12 = *(long *)&pq2.mData[-1].count;
          if (lVar12 != 0) {
            paVar20 = &pq2.mData[lVar12 + -1].title.field_2;
            lVar22 = lVar12 * -0x48;
            do {
              if (paVar20 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar20->_M_allocated_capacity)[-2]) {
                operator_delete((long *)(&paVar20->_M_allocated_capacity)[-2],
                                paVar20->_M_allocated_capacity + 1);
              }
              if (&paVar20->_M_allocated_capacity + -4 !=
                  (size_type *)(&paVar20->_M_allocated_capacity)[-6]) {
                operator_delete((size_type *)(&paVar20->_M_allocated_capacity)[-6],
                                (&paVar20->_M_allocated_capacity)[-4] + 1);
              }
              paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(&paVar20->_M_allocated_capacity + -9);
              lVar22 = lVar22 + 0x48;
            } while (lVar22 != 0);
          }
          operator_delete__(&pSVar15[-1].count,lVar12 * 0x48 + 8);
        }
        pq2.mData = (Song *)(puVar11 + 1);
        pq2.mCap = uVar21;
      }
      pSVar15 = pq2.mData + pq2.mSize;
      std::__cxx11::string::_M_assign((string *)pSVar15);
      std::__cxx11::string::_M_assign((string *)&pSVar15->title);
      pSVar15->count = local_78.count;
      sVar18 = pq2.mSize;
      pSVar15 = pq2.mData + pq2.mSize;
      pq2.mSize = pq2.mSize + 1;
      Song::Song((Song *)local_158,pSVar15);
      while (sVar18 != 0) {
        uVar21 = sVar18 - 1 >> 1;
        if (local_118 == pq2.mData[uVar21].count) {
          if ((local_158._8_8_ == pq2.mData[uVar21].artist._M_string_length) &&
             ((local_158._8_8_ == 0 ||
              (iVar8 = bcmp((void *)local_158._0_8_,pq2.mData[uVar21].artist._M_dataplus._M_p,
                            local_158._8_8_), iVar8 == 0)))) {
            iVar8 = std::__cxx11::string::compare((string *)&local_138);
          }
          else {
            iVar8 = std::__cxx11::string::compare((string *)local_158);
          }
          bVar7 = 0 < iVar8;
        }
        else {
          bVar7 = local_118 < pq2.mData[uVar21].count;
        }
        pSVar15 = pq2.mData;
        if (bVar7) goto LAB_00102bdb;
        pSVar1 = pq2.mData + sVar18;
        std::__cxx11::string::_M_assign((string *)pSVar1);
        std::__cxx11::string::_M_assign((string *)&pSVar1->title);
        pSVar1->count = pSVar15[uVar21].count;
        sVar18 = uVar21;
      }
      sVar18 = 0;
LAB_00102bdb:
      pSVar15 = pq2.mData + sVar18;
      std::__cxx11::string::_M_assign((string *)pSVar15);
      std::__cxx11::string::_M_assign((string *)&pSVar15->title);
      pSVar15->count = local_118;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_p != &local_128) {
        operator_delete(local_138._M_p,local_128._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.title._M_dataplus._M_p != &local_78.title.field_2) {
        operator_delete(local_78.title._M_dataplus._M_p,
                        local_78.title.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.artist._M_dataplus._M_p != &local_78.artist.field_2) {
        operator_delete(local_78.artist._M_dataplus._M_p,
                        local_78.artist.field_2._M_allocated_capacity + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
      }
      iVar6 = local_c4;
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
      }
      iVar8 = iVar6 + 1;
    } while (iVar6 + 1 < local_bc);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--- Order By Artist-Title-count ---",0x23);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  if (pq1.mSize != 0) {
    do {
      poVar13 = operator<<((ostream *)&std::cout,pq1.mData);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      sVar18 = pq1.mSize;
      pSVar15 = pq1.mData;
      if (pq1.mSize == 0) {
        this = (out_of_range *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range(this,"index of out range");
        goto LAB_00103266;
      }
      std::__cxx11::string::_M_assign((string *)pq1.mData);
      std::__cxx11::string::_M_assign((string *)&pSVar15->title);
      pSVar15->count = pSVar15[sVar18 - 1].count;
      pq1.mSize = pq1.mSize - 1;
      Song::Song((Song *)local_158,pq1.mData);
      if (pq1.mSize < 2) {
        uVar21 = 0;
      }
      else {
        uVar10 = 1;
        lVar12 = 0;
        pSVar15 = extraout_RDX_01;
        uVar21 = 0;
        do {
          uVar16 = lVar12 + 2;
          uVar17 = uVar10;
          if ((uVar16 < pq1.mSize) &&
             (bVar7 = CP::
                      priority_queue<Song,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/noppakorn[P]2110211/grader/d58_q2_custom/song.h:30:11)>
                      ::anon_class_1_0_00000001_for_mLess::operator()
                                ((anon_class_1_0_00000001_for_mLess *)(pq1.mData + uVar10),
                                 pq1.mData + uVar16,pSVar15), pSVar15 = extraout_RDX_02,
             uVar17 = uVar16, !bVar7)) {
            uVar17 = uVar10;
          }
          bVar7 = CP::
                  priority_queue<Song,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/noppakorn[P]2110211/grader/d58_q2_custom/song.h:30:11)>
                  ::anon_class_1_0_00000001_for_mLess::operator()
                            ((anon_class_1_0_00000001_for_mLess *)(pq1.mData + uVar17),
                             (Song *)local_158,pSVar15);
          pSVar15 = pq1.mData;
          if (bVar7) break;
          pSVar1 = pq1.mData + uVar21;
          std::__cxx11::string::_M_assign((string *)pSVar1);
          std::__cxx11::string::_M_assign((string *)&pSVar1->title);
          pSVar1->count = pSVar15[uVar17].count;
          lVar12 = uVar17 * 2;
          uVar10 = uVar17 * 2 + 1;
          pSVar15 = extraout_RDX_03;
          uVar21 = uVar17;
        } while (uVar10 < pq1.mSize);
      }
      pSVar15 = pq1.mData + uVar21;
      std::__cxx11::string::_M_assign((string *)pSVar15);
      std::__cxx11::string::_M_assign((string *)&pSVar15->title);
      pSVar15->count = local_118;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_p != &local_128) {
        operator_delete(local_138._M_p,local_128._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
    } while (pq1.mSize != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--- Order By count-Artist-Title ---",0x23);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  while( true ) {
    if (pq2.mSize == 0) {
      return 0;
    }
    poVar13 = operator<<((ostream *)&std::cout,pq2.mData);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    sVar18 = pq2.mSize;
    pSVar15 = pq2.mData;
    if (pq2.mSize == 0) break;
    std::__cxx11::string::_M_assign((string *)pq2.mData);
    std::__cxx11::string::_M_assign((string *)&pSVar15->title);
    pSVar15->count = pSVar15[sVar18 - 1].count;
    pq2.mSize = pq2.mSize - 1;
    Song::Song((Song *)local_158,pq2.mData);
    if (pq2.mSize < 2) {
      uVar21 = 0;
    }
    else {
      uVar10 = 1;
      lVar12 = 0;
      uVar21 = 0;
      do {
        uVar16 = lVar12 + 2;
        uVar17 = uVar10;
        if (uVar16 < pq2.mSize) {
          if (pq2.mData[uVar10].count == pq2.mData[uVar16].count) {
            pSVar15 = pq2.mData + uVar10;
            sVar2 = (pSVar15->artist)._M_string_length;
            if ((sVar2 == pq2.mData[uVar16].artist._M_string_length) &&
               ((sVar2 == 0 ||
                (iVar8 = bcmp((pSVar15->artist)._M_dataplus._M_p,
                              pq2.mData[uVar16].artist._M_dataplus._M_p,sVar2), iVar8 == 0)))) {
              iVar8 = std::__cxx11::string::compare((string *)&pSVar15->title);
            }
            else {
              iVar8 = std::__cxx11::string::compare((string *)pSVar15);
            }
            bVar7 = 0 < iVar8;
          }
          else {
            bVar7 = pq2.mData[uVar10].count < pq2.mData[uVar16].count;
          }
          uVar17 = uVar16;
          if (!bVar7) {
            uVar17 = uVar10;
          }
        }
        if (pq2.mData[uVar17].count == local_118) {
          pSVar15 = pq2.mData + uVar17;
          sVar2 = (pSVar15->artist)._M_string_length;
          if ((sVar2 == local_158._8_8_) &&
             ((sVar2 == 0 ||
              (iVar8 = bcmp((pSVar15->artist)._M_dataplus._M_p,(void *)local_158._0_8_,sVar2),
              iVar8 == 0)))) {
            iVar8 = std::__cxx11::string::compare((string *)&pSVar15->title);
          }
          else {
            iVar8 = std::__cxx11::string::compare((string *)pSVar15);
          }
          bVar7 = 0 < iVar8;
        }
        else {
          bVar7 = pq2.mData[uVar17].count < local_118;
        }
        pSVar15 = pq2.mData;
        if (bVar7) break;
        pSVar1 = pq2.mData + uVar21;
        std::__cxx11::string::_M_assign((string *)pSVar1);
        std::__cxx11::string::_M_assign((string *)&pSVar1->title);
        pSVar1->count = pSVar15[uVar17].count;
        lVar12 = uVar17 * 2;
        uVar10 = uVar17 * 2 + 1;
        uVar21 = uVar17;
      } while (uVar10 < pq2.mSize);
    }
    pSVar15 = pq2.mData + uVar21;
    std::__cxx11::string::_M_assign((string *)pSVar15);
    std::__cxx11::string::_M_assign((string *)&pSVar15->title);
    pSVar15->count = local_118;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_p != &local_128) {
      operator_delete(local_138._M_p,local_128._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    }
  }
  this = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this,"index of out range");
LAB_00103266:
  __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

int main() {
  int n;
  cin >> n;
  for (int i = 0;i < n;i++) {
    string title,artist;
    int count;
    cin >> title >> artist >> count;
    Song s(title,artist,count);
    pq1.push(s);
    pq2.push(s);
  }

  cout << "--- Order By Artist-Title-count ---" << endl;
  while (pq1.empty() == false) {
    cout << pq1.top() << endl;
    pq1.pop();
  }

  cout << "--- Order By count-Artist-Title ---" << endl;
  while (pq2.empty() == false) {
    cout << pq2.top() << endl;
    pq2.pop();
  }
}